

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpressionGenerator.cpp
# Opt level: O0

Expression * __thiscall
rsg::ExpressionGenerator::generate
          (ExpressionGenerator *this,ValueRange *valueRange,int initialDepth)

{
  GeneratorState *state;
  ConstValueRangeAccess valueRange_00;
  exception *anon_var_0;
  ConstValueRangeAccess local_40;
  Expression *local_28;
  Expression *root;
  ValueRange *pVStack_18;
  int initialDepth_local;
  ValueRange *valueRange_local;
  ExpressionGenerator *this_local;
  
  root._4_4_ = initialDepth;
  pVStack_18 = valueRange;
  valueRange_local = (ValueRange *)this;
  GeneratorState::setExpressionDepth(this->m_state,initialDepth);
  state = this->m_state;
  ValueRange::operator_cast_to_ConstValueRangeAccess(&local_40,pVStack_18);
  valueRange_00.m_min = local_40.m_min;
  valueRange_00.m_type = local_40.m_type;
  valueRange_00.m_max = local_40.m_max;
  local_28 = Expression::createRandom(state,valueRange_00);
  generate(this,local_28);
  return local_28;
}

Assistant:

Expression* ExpressionGenerator::generate (const ValueRange& valueRange, int initialDepth)
{
	// Create root
	m_state.setExpressionDepth(initialDepth);
	Expression* root = Expression::createRandom(m_state, valueRange);

	try
	{
		// Generate full expression
		generate(root);
	}
	catch (const std::exception&)
	{
		delete root;
		m_expressionStack.clear();
		throw;
	}

	return root;
}